

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_drbg.c
# Opt level: O1

int hmac_drbg_reseed_core(mbedtls_hmac_drbg_context *ctx,uchar *additional,size_t len,int use_nonce)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uchar local_1b8 [8];
  uchar seed [384];
  
  uVar3 = ctx->entropy_len * 3 >> 1;
  if (use_nonce == 0) {
    uVar3 = ctx->entropy_len;
  }
  iVar2 = -5;
  if ((len < 0x101) && (uVar3 + len < 0x181)) {
    memset(local_1b8,0,0x180);
    iVar1 = (*ctx->f_entropy)(ctx->p_entropy,local_1b8,ctx->entropy_len);
    iVar2 = -9;
    if (iVar1 == 0) {
      uVar3 = ctx->entropy_len;
      seed._376_8_ = additional;
      if (use_nonce != 0) {
        iVar2 = (*ctx->f_entropy)(ctx->p_entropy,local_1b8 + uVar3,uVar3 >> 1);
        if (iVar2 != 0) {
          return -9;
        }
        uVar3 = uVar3 + (ctx->entropy_len >> 1);
      }
      if (len != 0 && seed._376_8_ != 0) {
        memcpy(local_1b8 + uVar3,(void *)seed._376_8_,len);
        uVar3 = uVar3 + len;
      }
      iVar2 = mbedtls_hmac_drbg_update(ctx,local_1b8,uVar3);
      if (iVar2 == 0) {
        ctx->reseed_counter = 1;
      }
      mbedtls_platform_zeroize(local_1b8,uVar3);
    }
  }
  return iVar2;
}

Assistant:

static int hmac_drbg_reseed_core(mbedtls_hmac_drbg_context *ctx,
                                 const unsigned char *additional, size_t len,
                                 int use_nonce)
{
    unsigned char seed[MBEDTLS_HMAC_DRBG_MAX_SEED_INPUT];
    size_t seedlen = 0;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    {
        size_t total_entropy_len;

        if (use_nonce == 0) {
            total_entropy_len = ctx->entropy_len;
        } else {
            total_entropy_len = ctx->entropy_len * 3 / 2;
        }

        /* III. Check input length */
        if (len > MBEDTLS_HMAC_DRBG_MAX_INPUT ||
            total_entropy_len + len > MBEDTLS_HMAC_DRBG_MAX_SEED_INPUT) {
            return MBEDTLS_ERR_HMAC_DRBG_INPUT_TOO_BIG;
        }
    }

    memset(seed, 0, MBEDTLS_HMAC_DRBG_MAX_SEED_INPUT);

    /* IV. Gather entropy_len bytes of entropy for the seed */
    if ((ret = ctx->f_entropy(ctx->p_entropy,
                              seed, ctx->entropy_len)) != 0) {
        return MBEDTLS_ERR_HMAC_DRBG_ENTROPY_SOURCE_FAILED;
    }
    seedlen += ctx->entropy_len;

    /* For initial seeding, allow adding of nonce generated
     * from the entropy source. See Sect 8.6.7 in SP800-90A. */
    if (use_nonce) {
        /* Note: We don't merge the two calls to f_entropy() in order
         *       to avoid requesting too much entropy from f_entropy()
         *       at once. Specifically, if the underlying digest is not
         *       SHA-1, 3 / 2 * entropy_len is at least 36 Bytes, which
         *       is larger than the maximum of 32 Bytes that our own
         *       entropy source implementation can emit in a single
         *       call in configurations disabling SHA-512. */
        if ((ret = ctx->f_entropy(ctx->p_entropy,
                                  seed + seedlen,
                                  ctx->entropy_len / 2)) != 0) {
            return MBEDTLS_ERR_HMAC_DRBG_ENTROPY_SOURCE_FAILED;
        }

        seedlen += ctx->entropy_len / 2;
    }


    /* 1. Concatenate entropy and additional data if any */
    if (additional != NULL && len != 0) {
        memcpy(seed + seedlen, additional, len);
        seedlen += len;
    }

    /* 2. Update state */
    if ((ret = mbedtls_hmac_drbg_update(ctx, seed, seedlen)) != 0) {
        goto exit;
    }

    /* 3. Reset reseed_counter */
    ctx->reseed_counter = 1;

exit:
    /* 4. Done */
    mbedtls_platform_zeroize(seed, seedlen);
    return ret;
}